

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<double> * __thiscall
VW::config::typed_option<double>::default_value(typed_option<double> *this,double value)

{
  typed_option<double> *in_RDI;
  double *in_stack_00000008;
  shared_ptr<double> *in_stack_ffffffffffffffe0;
  
  std::make_shared<double,double&>(in_stack_00000008);
  std::shared_ptr<double>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<double> *)in_RDI);
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)0x173c96);
  return in_RDI;
}

Assistant:

typed_option& default_value(T value)
  {
    m_default_value = std::make_shared<T>(value);
    return *this;
  }